

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O0

void __thiscall HEkk::debugInitialise(HEkk *this)

{
  HEkk *in_RDI;
  HighsInt debug_basis_id;
  HighsInt time_to_solve_call_num;
  HighsInt time_from_solve_call_num;
  HighsInt debug_build_synthetic_tick;
  HighsInt debug_to_solve_call_num;
  HighsInt debug_num_solve;
  HighsInt debug_from_solve_call_num;
  HighsInt in_stack_0000004c;
  HEkk *in_stack_00000050;
  bool local_31;
  
  in_RDI->debug_solve_call_num_ = in_RDI->debug_solve_call_num_ + 1;
  in_RDI->debug_initial_build_synthetic_tick_ = (int)in_RDI->build_synthetic_tick_;
  if (in_RDI->debug_solve_call_num_ < -0xc) {
    in_RDI->debug_solve_report_ = false;
  }
  else if (in_RDI->debug_solve_call_num_ == -0xc) {
    in_RDI->debug_solve_report_ = in_RDI->build_synthetic_tick_ == 445560.0;
  }
  else if (-10 < in_RDI->debug_solve_call_num_) {
    in_RDI->debug_solve_report_ = false;
  }
  local_31 = false;
  if (-2 < in_RDI->debug_solve_call_num_) {
    local_31 = in_RDI->debug_solve_call_num_ < 0;
  }
  in_RDI->time_report_ = local_31;
  in_RDI->debug_basis_report_ = (in_RDI->basis_).debug_id == -999;
  if ((in_RDI->debug_solve_report_ & 1U) != 0) {
    printf("HEkk::solve call %d\n",(ulong)(uint)in_RDI->debug_solve_call_num_);
    debugReporting(in_RDI,-1,2);
    debugReporting(in_RDI,0,3);
  }
  if ((in_RDI->time_report_ & 1U) != 0) {
    timeReporting(in_stack_00000050,in_stack_0000004c);
    timeReporting(in_stack_00000050,in_stack_0000004c);
  }
  if ((in_RDI->debug_basis_report_ & 1U) != 0) {
    printf("HEkk::solve basis %d\n",0xfffffc19);
  }
  return;
}

Assistant:

void HEkk::debugInitialise() {
  debug_solve_call_num_++;
  debug_initial_build_synthetic_tick_ = build_synthetic_tick_;
  const HighsInt debug_from_solve_call_num = -12;
  const HighsInt debug_num_solve = 3;
  const HighsInt debug_to_solve_call_num =
      debug_from_solve_call_num + debug_num_solve - 1;
  const HighsInt debug_build_synthetic_tick = 445560;
  if (debug_solve_call_num_ < debug_from_solve_call_num) {
    debug_solve_report_ = false;
  } else if (debug_solve_call_num_ == debug_from_solve_call_num) {
    debug_solve_report_ = build_synthetic_tick_ == debug_build_synthetic_tick;
  } else if (debug_solve_call_num_ > debug_to_solve_call_num) {
    debug_solve_report_ = false;
  }
  const HighsInt time_from_solve_call_num = -1;
  const HighsInt time_to_solve_call_num = time_from_solve_call_num;
  time_report_ = debug_solve_call_num_ >= time_from_solve_call_num &&
                 debug_solve_call_num_ <= time_to_solve_call_num;
  const HighsInt debug_basis_id = -999;
  debug_basis_report_ = basis_.debug_id == debug_basis_id;
  if (debug_solve_report_) {
    printf("HEkk::solve call %d\n", (int)debug_solve_call_num_);
    debugReporting(-1);
    debugReporting(0, kHighsLogDevLevelVerbose);  // Detailed); //
  }
  if (time_report_) {
    timeReporting(-1);
    timeReporting(0);
  }
  if (debug_basis_report_) {
    printf("HEkk::solve basis %d\n", (int)debug_basis_id);
  }
}